

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall cmGraphVizWriter::~cmGraphVizWriter(cmGraphVizWriter *this)

{
  cmGraphVizWriter *this_local;
  
  ~cmGraphVizWriter(this);
  operator_delete(this,0x418);
  return;
}

Assistant:

cmGraphVizWriter::~cmGraphVizWriter()
{
  this->WriteFooter(this->GlobalFileStream);
}